

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_timestamp(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long extraout_RAX;
  ulong uVar8;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  DIR *__dirp;
  dirent *pdVar17;
  FILE *__stream;
  long lVar18;
  uint extraout_EDX;
  char *__dest;
  ulong uVar19;
  char *pcVar20;
  DIR *__s;
  DIR *__name;
  char *pcVar21;
  DIR *pDVar22;
  DIR *__filename;
  undefined8 uVar23;
  DIR *pDVar24;
  undefined1 *unaff_R13;
  char *pcVar25;
  char *pcVar26;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  int32_t increment;
  int32_t timestamp;
  undefined1 auStack_7318 [8];
  undefined1 auStack_7310 [504];
  ulong uStack_7118;
  DIR *pDStack_7110;
  char *pcStack_7108;
  DIR *pDStack_7100;
  DIR *pDStack_70f8;
  int iStack_70ec;
  DIR *pDStack_70e8;
  stat sStack_70e0;
  char acStack_7050 [512];
  size_t sStack_6e50;
  char *pcStack_6e48;
  DIR *pDStack_6e40;
  char *pcStack_6e38;
  code *pcStack_6e30;
  char *pcStack_6e28;
  ulong uStack_6e20;
  char *pcStack_6e18;
  DIR *pDStack_6e10;
  undefined8 *puStack_6e08;
  undefined8 uStack_6dd0;
  undefined1 *puStack_6dc8;
  undefined1 *puStack_6dc0;
  undefined1 auStack_6db0 [8];
  char *pcStack_6da8;
  undefined8 uStack_6d98;
  char *pcStack_6d90;
  undefined8 uStack_6d88;
  undefined8 uStack_6d70;
  DIR aDStack_6d00 [25944];
  char *pcStack_7a8;
  char *pcStack_7a0;
  char *pcStack_798;
  char *pcStack_790;
  code *apcStack_788 [2];
  undefined1 auStack_778 [116];
  uint uStack_704;
  char acStack_700 [256];
  undefined8 uStack_600;
  char *pcStack_5f8;
  char *pcStack_5f0;
  char *pcStack_5e8;
  char *pcStack_5e0;
  char *pcStack_5d8;
  char *pcStack_5d0;
  undefined8 uStack_5c8;
  code *pcStack_5c0;
  char *pcStack_5b8;
  undefined8 uStack_5b0;
  char *pcStack_5a8;
  char *pcStack_5a0;
  char *pcStack_598;
  char *pcStack_590;
  code *pcStack_588;
  undefined8 uStack_580;
  undefined8 uStack_578;
  char *pcStack_570;
  char *pcStack_568;
  char *pcStack_560;
  undefined8 uStack_558;
  bson_t *pbStack_550;
  char *pcStack_548;
  code *pcStack_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  char *pcStack_520;
  char *pcStack_518;
  char *pcStack_510;
  char *pcStack_508;
  char *pcStack_500;
  code *pcStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined1 *puStack_4d8;
  char *pcStack_4d0;
  char *pcStack_4c8;
  code *pcStack_4c0;
  undefined8 uStack_4b8;
  ulong uStack_4b0;
  ulong uStack_4a8;
  undefined1 *puStack_4a0;
  char *pcStack_498;
  void *pvStack_490;
  code *pcStack_488;
  uint uStack_404;
  undefined1 auStack_400 [4];
  uint uStack_3fc;
  ulong uStack_2b0;
  ulong uStack_2a8;
  undefined1 *puStack_2a0;
  char *pcStack_298;
  void *pvStack_290;
  code *apcStack_288 [16];
  uint uStack_204;
  undefined1 auStack_200 [4];
  uint uStack_1fc;
  undefined8 uStack_a0;
  long lStack_40;
  undefined8 uStack_38;
  code *pcStack_30;
  undefined8 local_28;
  int local_20;
  int local_1c;
  
  pcStack_30 = (code *)0x13bdf0;
  uVar6 = bson_bcon_magic();
  pvVar10 = (void *)0x0;
  local_28 = 0;
  pcStack_30 = (code *)0x13be1e;
  uVar6 = bcon_new(0,"foo",uVar6,0x10,100,1000);
  pcStack_30 = (code *)0x13be26;
  uVar7 = bson_bcone_magic();
  local_28 = 0;
  pcStack_30 = (code *)0x13be49;
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x10,&local_1c,&local_20);
  if (cVar1 == '\0') {
    pcStack_30 = (code *)0x13be75;
    test_timestamp_cold_1();
LAB_0013be75:
    pcStack_30 = (code *)0x13be7a;
    test_timestamp_cold_2();
  }
  else {
    if (local_1c != 100) goto LAB_0013be75;
    if (local_20 == 1000) {
      pcStack_30 = (code *)0x13be66;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_30 = test_int64;
  test_timestamp_cold_3();
  pcStack_30 = (code *)0x13e3df;
  lStack_40 = extraout_RAX;
  uStack_38 = uVar6;
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x11,10,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x11,&lStack_40,0);
  if (cVar1 == '\0') {
    test_int64_cold_1();
  }
  else if (lStack_40 == 10) {
    bson_destroy(uVar6);
    return;
  }
  test_int64_cold_2();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x13,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x13,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_maxkey_cold_1();
  uVar6 = bson_bcon_magic();
  uVar6 = bcon_new(0,"foo",uVar6,0x14,0);
  uVar7 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar6,"foo",uVar7,0x14,0);
  if (cVar1 != '\0') {
    bson_destroy(uVar6);
    return;
  }
  test_minkey_cold_1();
  apcStack_288[0] = (code *)0x13bfe3;
  uStack_a0 = uVar6;
  uVar8 = bcon_new(0,"bar","baz",0);
  apcStack_288[0] = (code *)0x13bfeb;
  uVar6 = bson_bcon_magic();
  pcVar26 = "foo";
  apcStack_288[0] = (code *)0x13c00c;
  uVar9 = bcon_new(0,"foo",uVar6,2,uVar8,0);
  apcStack_288[0] = (code *)0x13c014;
  uVar6 = bson_bcone_magic();
  apcStack_288[0] = (code *)0x13c034;
  cVar1 = bcon_extract(uVar9,"foo",uVar6,2,auStack_200,0);
  if (cVar1 == '\0') {
LAB_0013c1b7:
    apcStack_288[0] = (code *)0x13c1bc;
    test_bson_document_cold_1();
LAB_0013c1bc:
    apcStack_288[0] = (code *)0x13c1c1;
    test_bson_document_cold_6();
LAB_0013c1c1:
    apcStack_288[0] = (code *)0x13c1c6;
    test_bson_document_cold_5();
LAB_0013c1c6:
    apcStack_288[0] = (code *)0x13c1cb;
    test_bson_document_cold_2();
  }
  else {
    apcStack_288[0] = (code *)0x13c04c;
    pvVar10 = (void *)bson_get_data(auStack_200);
    apcStack_288[0] = (code *)0x13c057;
    pcVar26 = (char *)bson_get_data(uVar8);
    if (*(uint *)(uVar8 + 4) == uStack_1fc) {
      apcStack_288[0] = (code *)0x13c06b;
      pvVar11 = (void *)bson_get_data(uVar8);
      apcStack_288[0] = (code *)0x13c07b;
      pvVar12 = (void *)bson_get_data(auStack_200);
      apcStack_288[0] = (code *)0x13c089;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar8 + 4));
      if (iVar2 == 0) {
        apcStack_288[0] = (code *)0x13c09a;
        bson_destroy(auStack_200);
        apcStack_288[0] = (code *)0x13c0a2;
        bson_destroy(uVar8);
        apcStack_288[0] = (code *)0x13c0aa;
        bson_destroy(uVar9);
        return;
      }
    }
    unaff_R13 = auStack_200;
    apcStack_288[0] = (code *)0x13c0cb;
    uVar6 = bson_as_canonical_extended_json(unaff_R13);
    apcStack_288[0] = (code *)0x13c0d8;
    uVar7 = bson_as_canonical_extended_json(uVar8);
    uVar9 = 0xffffffff;
    if (uStack_1fc != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar8 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar10 + uVar19) != pcVar26[uVar19]) {
          uVar9 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_1fc != (uint)uVar19);
    }
    if ((int)uVar9 == -1) {
      uVar3 = uStack_1fc;
      if (uStack_1fc < *(uint *)(uVar8 + 4)) {
        uVar3 = *(uint *)(uVar8 + 4);
      }
      uVar9 = (ulong)(uVar3 - 1);
    }
    apcStack_288[0] = (code *)0x13c133;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar6,uVar7);
    apcStack_288[0] = (code *)0x13c14b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar9 = (ulong)uVar3;
    apcStack_288[0] = (code *)0x13c166;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_204 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c1bc;
    unaff_R13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c1c1;
    uVar9 = (ulong)uStack_1fc;
    apcStack_288[0] = (code *)0x13c190;
    uVar19 = write(uVar3,pvVar10,uVar9);
    if (uVar19 != uVar9) goto LAB_0013c1c6;
    uVar8 = (ulong)*(uint *)(uVar8 + 4);
    apcStack_288[0] = (code *)0x13c1a6;
    uVar19 = write(uVar4,pcVar26,uVar8);
    if (uVar19 == uVar8) {
      apcStack_288[0] = (code *)0x13c1b7;
      test_bson_document_cold_4();
      goto LAB_0013c1b7;
    }
  }
  apcStack_288[0] = test_bson_array;
  test_bson_document_cold_3();
  pcStack_488 = (code *)0x13c201;
  uStack_2b0 = uVar8;
  uStack_2a8 = uVar9;
  puStack_2a0 = unaff_R13;
  pcStack_298 = pcVar26;
  pvStack_290 = pvVar10;
  apcStack_288[0] = (code *)&stack0xffffffffffffff88;
  uVar8 = bcon_new(0,"0","baz",0);
  pcStack_488 = (code *)0x13c209;
  uVar6 = bson_bcon_magic();
  pcVar26 = "foo";
  pcStack_488 = (code *)0x13c22a;
  uVar9 = bcon_new(0,"foo",uVar6,3,uVar8,0);
  pcStack_488 = (code *)0x13c232;
  uVar6 = bson_bcone_magic();
  pcStack_488 = (code *)0x13c252;
  cVar1 = bcon_extract(uVar9,"foo",uVar6,3,auStack_400,0);
  if (cVar1 == '\0') {
LAB_0013c3d5:
    pcStack_488 = (code *)0x13c3da;
    test_bson_array_cold_1();
LAB_0013c3da:
    pcStack_488 = (code *)0x13c3df;
    test_bson_array_cold_6();
LAB_0013c3df:
    pcStack_488 = (code *)0x13c3e4;
    test_bson_array_cold_5();
LAB_0013c3e4:
    pcStack_488 = (code *)0x13c3e9;
    test_bson_array_cold_2();
  }
  else {
    pcStack_488 = (code *)0x13c26a;
    pvVar10 = (void *)bson_get_data(auStack_400);
    pcStack_488 = (code *)0x13c275;
    pcVar26 = (char *)bson_get_data(uVar8);
    if (*(uint *)(uVar8 + 4) == uStack_3fc) {
      pcStack_488 = (code *)0x13c289;
      pvVar11 = (void *)bson_get_data(uVar8);
      pcStack_488 = (code *)0x13c299;
      pvVar12 = (void *)bson_get_data(auStack_400);
      pcStack_488 = (code *)0x13c2a7;
      iVar2 = bcmp(pvVar11,pvVar12,(ulong)*(uint *)(uVar8 + 4));
      if (iVar2 == 0) {
        pcStack_488 = (code *)0x13c2b8;
        bson_destroy(auStack_400);
        pcStack_488 = (code *)0x13c2c0;
        bson_destroy(uVar8);
        pcStack_488 = (code *)0x13c2c8;
        bson_destroy(uVar9);
        return;
      }
    }
    unaff_R13 = auStack_400;
    pcStack_488 = (code *)0x13c2e9;
    uVar6 = bson_as_canonical_extended_json(unaff_R13);
    pcStack_488 = (code *)0x13c2f6;
    uVar7 = bson_as_canonical_extended_json(uVar8);
    uVar9 = 0xffffffff;
    if (uStack_3fc != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(uVar8 + 4) == (int)uVar19) break;
        if (*(char *)((long)pvVar10 + uVar19) != pcVar26[uVar19]) {
          uVar9 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (uStack_3fc != (uint)uVar19);
    }
    if ((int)uVar9 == -1) {
      uVar3 = uStack_3fc;
      if (uStack_3fc < *(uint *)(uVar8 + 4)) {
        uVar3 = *(uint *)(uVar8 + 4);
      }
      uVar9 = (ulong)(uVar3 - 1);
    }
    pcStack_488 = (code *)0x13c351;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar9,uVar6,uVar7);
    pcStack_488 = (code *)0x13c369;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar9 = (ulong)uVar3;
    pcStack_488 = (code *)0x13c384;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_404 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c3da;
    unaff_R13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c3df;
    uVar9 = (ulong)uStack_3fc;
    pcStack_488 = (code *)0x13c3ae;
    uVar19 = write(uVar3,pvVar10,uVar9);
    if (uVar19 != uVar9) goto LAB_0013c3e4;
    uVar8 = (ulong)*(uint *)(uVar8 + 4);
    pcStack_488 = (code *)0x13c3c4;
    uVar19 = write(uVar4,pcVar26,uVar8);
    if (uVar19 == uVar8) {
      pcStack_488 = (code *)0x13c3d5;
      test_bson_array_cold_4();
      goto LAB_0013c3d5;
    }
  }
  pcStack_488 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_4c0 = (code *)0x13c3fe;
  uStack_4b8 = extraout_RAX_00;
  uStack_4b0 = uVar8;
  uStack_4a8 = uVar9;
  puStack_4a0 = unaff_R13;
  pcStack_498 = pcVar26;
  pvStack_490 = pvVar10;
  pcStack_488 = (code *)apcStack_288;
  uStack_4e8 = bson_bcon_magic();
  pcStack_4c8 = (char *)0x0;
  pcStack_4d0 = "]";
  puStack_4d8 = (undefined1 *)0x2;
  uStack_4e0 = 0xf;
  uStack_4f0 = 0x13c446;
  uVar6 = bcon_new(0,"foo","[",uStack_4e8,0xf,1);
  pcStack_4c0 = (code *)0x13c452;
  uStack_4e8 = bson_bcone_magic();
  pcStack_4c8 = (char *)0x0;
  pcStack_4d0 = "]";
  uStack_4e0 = 0xf;
  uStack_4f0 = 0x13c481;
  puStack_4d8 = (undefined1 *)&uStack_4b8;
  cVar1 = bcon_extract(uVar6,"foo","[",uStack_4e8,0xf,(long)&uStack_4b8 + 4);
  if (cVar1 == '\0') {
    pcStack_4c0 = (code *)0x13c4b2;
    test_inline_array_cold_1();
LAB_0013c4b2:
    pcStack_4c0 = (code *)0x13c4b7;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_4b8._4_4_ != 1) goto LAB_0013c4b2;
    if ((int)uStack_4b8 == 2) {
      pcStack_4c0 = (code *)0x13c49e;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_4c0 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_4c0 = (code *)0x147feb;
  pcStack_4c8 = "[";
  pcStack_4d0 = "foo";
  puStack_4d8 = (undefined1 *)0x0;
  uStack_4e0 = 0xf;
  pcStack_4f8 = (code *)0x13c4cc;
  uStack_4f0 = extraout_RAX_01;
  uStack_4e8 = uVar6;
  pcStack_520 = (char *)bson_bcon_magic();
  pcStack_500 = (char *)0x0;
  pcStack_508 = "}";
  pcStack_510 = (char *)0x1;
  pcStack_518 = (char *)0xf;
  uStack_528 = "a";
  uStack_530 = 2;
  uStack_538 = 0x13c51f;
  uVar6 = bcon_new(0,"foo","{","b",pcStack_520,0xf);
  pcStack_4f8 = (code *)0x13c52b;
  pcStack_520 = (char *)bson_bcone_magic();
  uStack_530 = (long)&uStack_4f0 + 4;
  pcStack_500 = (char *)0x0;
  pcStack_508 = "}";
  pcStack_518 = (char *)0xf;
  uStack_528 = "b";
  uStack_538 = 0x13c56e;
  pcStack_510 = (char *)&uStack_4f0;
  cVar1 = bcon_extract(uVar6,"foo","{","a",pcStack_520,0xf);
  if (cVar1 == '\0') {
    pcStack_4f8 = (code *)0x13c59f;
    test_inline_doc_cold_1();
LAB_0013c59f:
    pcStack_4f8 = (code *)0x13c5a4;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_4f0._4_4_ != 1) goto LAB_0013c59f;
    if ((int)uStack_4f0 == 2) {
      pcStack_4f8 = (code *)0x13c58b;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_4f8 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_4f8 = (code *)0x0;
  pcStack_500 = "a";
  pcStack_510 = "{";
  pcStack_518 = "foo";
  pcStack_520 = "}";
  pcStack_540 = (code *)0x13c5bc;
  pcStack_508 = (char *)uVar6;
  uStack_578 = (undefined8 *)bson_bcon_magic();
  pcStack_540 = (code *)0x0;
  pcStack_548 = (char *)0x3;
  pbStack_550 = (bson_t *)0xf;
  pcStack_560 = "c";
  pcStack_568 = (char *)0x2;
  pcStack_570 = (char *)0xf;
  uStack_580 = 0x13c5fe;
  uStack_558 = uStack_578;
  bson = (bson_t *)bcon_new(0,"a",uStack_578,0xf,1,"b");
  pcStack_540 = (code *)0x13c60a;
  pcStack_588 = (code *)bson_bcone_magic();
  pbStack_550 = (bson_t *)((long)&uStack_530 + 4);
  uStack_578 = &uStack_528;
  pcStack_548 = (char *)0x0;
  uStack_558 = 0xf;
  pcStack_568 = "c";
  pcStack_570 = (char *)0x0;
  uStack_580 = 0xf;
  pcStack_590 = "b";
  pcStack_598 = (char *)0x0;
  pcStack_5a0 = (char *)0x13c656;
  pcStack_560 = (char *)pcStack_588;
  test_extract_ctx_helper(bson,3,"a",pcStack_588,0xf,(long)&uStack_528 + 4);
  if (uStack_528._4_4_ == 1) {
    if ((int)uStack_528 != 2) goto LAB_0013c68b;
    if (uStack_530._4_4_ == 3) {
      pcStack_540 = (code *)0x13c677;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_540 = (code *)0x13c68b;
    test_extract_ctx_cold_1();
LAB_0013c68b:
    pcStack_540 = (code *)0x13c690;
    test_extract_ctx_cold_2();
  }
  pcStack_540 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_540 = (code *)0xf;
  pcStack_548 = "a";
  uStack_558 = 0;
  pcStack_568 = "c";
  pcStack_588 = (code *)0x13c6a8;
  pcStack_560 = (char *)((long)&uStack_528 + 4);
  pbStack_550 = bson;
  uStack_5b0 = bson_bcon_magic();
  pcStack_590 = (char *)0x0;
  pcStack_598 = "}";
  pcStack_5a0 = (char *)0xa;
  pcStack_5a8 = (char *)0xf;
  pcStack_5b8 = (char *)0x13c6fd;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_588 = (code *)0x13c709;
  uStack_5b0 = bson_bcone_magic();
  pcStack_5a0 = (char *)((long)&uStack_578 + 4);
  pcStack_590 = (char *)0x0;
  pcStack_598 = "}";
  pcStack_5a8 = (char *)0xf;
  pcStack_5b8 = "bar";
  pcStack_5c0 = (code *)0x13f9a8;
  uStack_5c8 = 0x13c745;
  cVar1 = bcon_extract(uVar6,"hello",uStack_5b0,0,&pcStack_570,"foo");
  if (cVar1 == '\0') {
    pcStack_588 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_588 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_588 = (code *)0x13c75e;
    iVar2 = strcmp("world",pcStack_570);
    if (iVar2 != 0) goto LAB_0013c785;
    if (uStack_578._4_4_ == 10) {
      pcStack_588 = (code *)0x13c771;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_588 = test_skip;
  test_nested_cold_3();
  pcStack_588 = (code *)0x148ce7;
  pcStack_590 = "bar";
  pcStack_598 = (char *)0x0;
  pcStack_5a0 = "hello";
  pcStack_5a8 = "foo";
  pcStack_5c0 = (code *)0x13c79f;
  uStack_5b0 = uVar6;
  pcStack_5e8 = (char *)bson_bcon_magic();
  uStack_5c8 = 0;
  pcStack_5d0 = "}";
  pcStack_5d8 = (char *)0xa;
  pcStack_5e0 = (char *)0xf;
  pcStack_5f0 = (char *)0x13c7f2;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_5c0 = (code *)0x13c7fe;
  pcVar26 = (char *)bson_bcone_magic();
  pcVar25 = "}";
  uStack_5c8 = 0;
  pcStack_5d0 = "}";
  pcStack_5d8 = (char *)0x10;
  pcStack_5e0 = (char *)0x1c;
  pcStack_5f0 = "bar";
  pcStack_5f8 = "{";
  uStack_600 = 0x13c83a;
  pcStack_5e8 = pcVar26;
  cVar1 = bcon_extract(uVar6,"hello",pcVar26,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_5c0 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_5c8 = 0;
    pcStack_5d0 = "}";
    pcStack_5d8 = (char *)0x12;
    pcStack_5e0 = (char *)0x1c;
    pcStack_5f0 = "bar";
    pcStack_5f8 = "{";
    uStack_600 = 0x13c879;
    pcStack_5e8 = pcVar26;
    cVar1 = bcon_extract(uVar6,"hello",pcVar26,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_5c0 = test_iter;
  test_skip_cold_2();
  pcStack_5c0 = (code *)0x14c89e;
  pcStack_5d0 = "bar";
  pcStack_5d8 = "}";
  pcStack_5e8 = "{";
  apcStack_788[0] = (code *)0x13c8be;
  pcStack_5e0 = pcVar26;
  uStack_5c8 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_788[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_788[0] = (code *)0x13c8ed;
  uVar6 = bson_bcone_magic();
  pcVar13 = acStack_700;
  pcVar20 = "foo";
  uVar7 = 0x1d;
  uVar23 = 0;
  apcStack_788[0] = (code *)0x13c90d;
  pcVar21 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  uVar6 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_788[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_788[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_788[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_788[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_788[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar21 = acStack_700;
    apcStack_788[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar21 = acStack_700;
    apcStack_788[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar23 = 0;
    apcStack_788[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_700);
    apcStack_788[0] = (code *)0x13c96f;
    pcVar26 = (char *)bson_get_data(__n_00);
    apcStack_788[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_788[0] = (code *)0x13c98e;
      pvVar10 = (void *)bson_get_data(__n);
      apcStack_788[0] = (code *)0x13c999;
      pvVar11 = (void *)bson_get_data(__n_00);
      apcStack_788[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_788[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_788[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_788[0] = (code *)0x13c9d4;
    uVar7 = bson_as_canonical_extended_json(__n_00);
    apcStack_788[0] = (code *)0x13c9e1;
    pcVar13 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar8 = 0xffffffff;
    if (uVar3 != 0) {
      uVar9 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar9) break;
        if (pcVar26[uVar9] != __buf[uVar9]) {
          uVar8 = uVar9 & 0xffffffff;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar3 != (uint)uVar9);
    }
    if ((int)uVar8 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar8 = (ulong)(uVar3 - 1);
    }
    apcStack_788[0] = (code *)0x13ca3c;
    uVar6 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8);
    apcStack_788[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar25 = (char *)(ulong)uVar3;
    pcVar21 = "failure.expected.bson";
    pcVar20 = (char *)0x42;
    apcStack_788[0] = (code *)0x13ca6f;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_704 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (uVar4 == 0xffffffff) goto LAB_0013cad0;
    pcVar25 = (char *)(ulong)uVar4;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar21 = (char *)(ulong)uVar3;
    apcStack_788[0] = (code *)0x13ca95;
    pcVar20 = pcVar26;
    pcVar14 = (char *)write(uVar3,pcVar26,(size_t)__n_00);
    if (pcVar14 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_788[0] = (code *)0x13caab;
      pcVar20 = __buf;
      pcVar21 = pcVar25;
      pcVar14 = (char *)write(uVar4,__buf,(size_t)__n);
      if (pcVar14 != __n) goto LAB_0013cada;
      pcVar21 = (char *)(ulong)uStack_704;
      pcVar20 = (char *)(ulong)uVar4;
      apcStack_788[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_788[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_788[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6dc0 = auStack_6db0;
  if (extraout_AL != '\0') {
    uStack_6d70 = uVar6;
  }
  puStack_6e08 = (undefined8 *)0x13cb62;
  pcStack_6da8 = pcVar20;
  uStack_6d98 = uVar7;
  pcStack_6d90 = pcVar13;
  uStack_6d88 = uVar23;
  pcStack_7a8 = __n;
  pcStack_7a0 = pcVar26;
  pcStack_798 = __buf;
  pcStack_790 = __n_00;
  apcStack_788[0] = (code *)&pcStack_5c0;
  bcon_extract_ctx_init(aDStack_6d00);
  puStack_6dc8 = auStack_778;
  uStack_6dd0 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_6da8) {
    uVar3 = (uint)pcStack_6da8;
    do {
      puStack_6e08 = (undefined8 *)0x13cbce;
      __s = aDStack_6d00;
      pcVar26 = pcVar21;
      cVar1 = bcon_extract_ctx_va(pcVar21,aDStack_6d00,&uStack_6dd0);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        puStack_6e08 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_6e30 = (code *)0x13cc03;
        __name = __s;
        pcStack_6e28 = pcVar21;
        uStack_6e20 = (ulong)uVar3;
        pcStack_6e18 = pcVar25;
        pDStack_6e10 = aDStack_6d00;
        puStack_6e08 = &uStack_6dd0;
        pcVar25 = (char *)strlen(pcVar26);
        pcStack_6e30 = (code *)0x13cc0e;
        pDVar22 = __s;
        sVar15 = strlen((char *)__s);
        if ((int)sVar15 + (int)pcVar25 < 499) {
          pcStack_6e30 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_6e30 = (code *)0x13cc38;
          strncat(__dest,pcVar26,(long)(int)pcVar25);
          pcStack_6e30 = (code *)0x13cc40;
          sVar16 = strlen(__dest);
          (__dest + sVar16)[0] = '/';
          (__dest + sVar16)[1] = '\0';
          pcStack_6e30 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar15);
          pcVar26 = __dest;
          do {
            if (*pcVar26 == '\\') {
              *pcVar26 = '/';
            }
            else if (*pcVar26 == '\0') {
              return;
            }
            pcVar26 = pcVar26 + 1;
          } while( true );
        }
        pcStack_6e30 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar8 = (ulong)extraout_EDX;
        pDStack_70f8 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_70ec = iVar2;
        sStack_6e50 = sVar15;
        pcStack_6e48 = pcVar25;
        pDStack_6e40 = __s;
        pcStack_6e38 = pcVar26;
        pcStack_6e30 = (code *)apcStack_788;
        __dirp = opendir((char *)__name);
        pDVar24 = pDVar22;
        pDStack_7100 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_70f8 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar17 = readdir(__dirp);
        if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar25 = "..";
        pDVar24 = (DIR *)0x147699;
        pDStack_70e8 = pDVar22;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_70f8 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar26,acStack_7050);
  pDStack_70f8 = (DIR *)0x13cd32;
  iVar5 = stat(pcVar26,&sStack_70e0);
  if ((iVar5 == 0) && ((sStack_70e0.st_mode & 0xf000) == 0x4000)) {
    pDStack_70f8 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_70e8,acStack_7050,iVar2,iStack_70ec);
    uVar8 = (ulong)uVar3;
  }
  else {
    pDStack_70f8 = (DIR *)0x13cd73;
    pcVar13 = strstr(pcVar26,".json");
    if (pcVar13 != (char *)0x0) {
      uVar8 = (ulong)(iVar2 + 1);
      pDStack_70f8 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar26,(char *)(pDStack_70e8 + (long)iVar2 * 500));
    }
  }
  pDStack_70f8 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar17 = readdir(__dirp);
  if (pdVar17 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_70f8 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar8;
  if (iVar2 < iStack_70ec) {
    do {
      pcVar26 = pdVar17->d_name;
      pDStack_70f8 = (DIR *)0x13ccea;
      iVar5 = strcmp(pcVar26,"..");
      if (iVar5 != 0) {
        pDStack_70f8 = (DIR *)0x13ccf9;
        iVar5 = strcmp(pcVar26,".");
        if (iVar5 != 0) goto LAB_0013cd12;
      }
      pDStack_70f8 = (DIR *)0x13cd05;
      pdVar17 = readdir(__dirp);
      if (pdVar17 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_70f8 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_7100 = __dirp;
LAB_0013cdc9:
  pDStack_70f8 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_7118 = uVar8;
  pDStack_7110 = pDVar24;
  pcStack_7108 = pcVar25;
  pDStack_70f8 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar15 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar15) {
      pvVar10 = (void *)bson_malloc0(sVar15);
      sVar16 = fread(pvVar10,1,sVar15,__stream);
      if (sVar16 != sVar15) {
        abort();
      }
      fclose(__stream);
      if (pvVar10 != (void *)0x0) {
        lVar18 = bson_new_from_json(pvVar10,sVar15,auStack_7318);
        if (lVar18 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7310);
          abort();
        }
        bson_free(pvVar10);
      }
    }
  }
  return;
}

Assistant:

static void
test_timestamp (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_timestamp (&expected, "foo", -1, 100, 1000);

   BCON_APPEND (&bcon, "foo", BCON_TIMESTAMP (100, 1000));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}